

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O2

void __thiscall ApplicationContext::~ApplicationContext(ApplicationContext *this)

{
  CSP *this_00;
  Blackboard *pBVar1;
  
  (this->super_ApplicationContextBase)._vptr_ApplicationContextBase =
       (_func_int **)&PTR__ApplicationContext_001df560;
  (this->super_ApplicationContextBase).join_now = true;
  this_00 = this->csp;
  if (this_00 != (CSP *)0x0) {
    CSP::~CSP(this_00);
  }
  operator_delete(this_00,0x2f0);
  pBVar1 = this->blackboard;
  if (pBVar1 != (Blackboard *)0x0) {
    std::
    _Rb_tree<int,_std::pair<const_int,_TypedData_*>,_std::_Select1st<std::pair<const_int,_TypedData_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_TypedData_*>_>_>
    ::~_Rb_tree(&(pBVar1->values)._M_t);
  }
  operator_delete(pBVar1,0x60);
  std::vector<Journal::Transaction,_std::allocator<Journal::Transaction>_>::~vector
            (&(this->journal).records);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->value_stack).super__Vector_base<float,_std::allocator<float>_>);
  ApplicationContextBase::~ApplicationContextBase(&this->super_ApplicationContextBase);
  return;
}

Assistant:

~ApplicationContext()
    {
        ///>
        /// join_now is most likely true from having been set by a Quit
        /// event, but just to be sure, set it here.
        ///<C++
        join_now = true;

        delete csp;
        delete blackboard;
    }